

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

SceneLight * __thiscall
CS248::Application::init_light(Application *this,LightInfo *light,Matrix4x4 *transform)

{
  long in_RSI;
  Matrix4x4 *unaff_retaddr;
  LightInfo *in_stack_00000008;
  PointLight *in_stack_00000010;
  LightInfo *in_stack_00000018;
  DirectionalLight *in_stack_00000020;
  Matrix4x4 *in_stack_00000070;
  LightInfo *in_stack_00000078;
  SpotLight *in_stack_00000080;
  Matrix4x4 *in_stack_00000190;
  LightInfo *in_stack_00000198;
  AreaLight *in_stack_000001a0;
  LightInfo *in_stack_ffffffffffffff98;
  AmbientLight *in_stack_ffffffffffffffa0;
  SceneLight *local_8;
  
  switch(*(undefined4 *)(in_RSI + 0x48)) {
  case 0:
  default:
    local_8 = (SceneLight *)0x0;
    break;
  case 1:
    local_8 = (SceneLight *)operator_new(0x18);
    DynamicScene::AmbientLight::AmbientLight(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    break;
  case 2:
    local_8 = (SceneLight *)operator_new(0x30);
    DynamicScene::DirectionalLight::DirectionalLight
              (in_stack_00000020,in_stack_00000018,(Matrix4x4 *)in_stack_00000010);
    break;
  case 3:
    local_8 = (SceneLight *)operator_new(0x78);
    DynamicScene::AreaLight::AreaLight(in_stack_000001a0,in_stack_00000198,in_stack_00000190);
    break;
  case 4:
    local_8 = (SceneLight *)operator_new(0x30);
    DynamicScene::PointLight::PointLight(in_stack_00000010,in_stack_00000008,unaff_retaddr);
    break;
  case 5:
    local_8 = (SceneLight *)operator_new(0x48);
    DynamicScene::SpotLight::SpotLight(in_stack_00000080,in_stack_00000078,in_stack_00000070);
  }
  return local_8;
}

Assistant:

DynamicScene::SceneLight *Application::init_light(LightInfo &light,
                                                  const Matrix4x4 &transform) {
  switch (light.light_type) {
    case Collada::LightType::NONE:
      break;
    case Collada::LightType::AMBIENT:
      return new DynamicScene::AmbientLight(light);
    case Collada::LightType::DIRECTIONAL:
      return new DynamicScene::DirectionalLight(light, transform);
    case Collada::LightType::AREA:
      return new DynamicScene::AreaLight(light, transform);
    case Collada::LightType::POINT:
      return new DynamicScene::PointLight(light, transform);
    case Collada::LightType::SPOT:
      return new DynamicScene::SpotLight(light, transform);
    default:
      break;
  }
  return nullptr;
}